

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void __thiscall duckdb::Vector::Slice(Vector *this,SelectionVector *sel,idx_t count,SelCache *cache)

{
  buffer_ptr<VectorBuffer> *this_00;
  data_ptr_t pdVar1;
  ulong uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  optional_idx oVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  VectorBuffer *pVVar5;
  VectorBuffer *pVVar6;
  mapped_type *this_02;
  idx_t index;
  ulong uVar7;
  _Hash_node_base *p_Var8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  string dictionary_id;
  optional_idx dictionary_size;
  sel_t *target_data;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  optional_idx local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  optional_idx local_60;
  _Hash_node_base *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  undefined8 uStack_38;
  
  if ((this->vector_type != DICTIONARY_VECTOR) || ((this->type).physical_type_ == STRUCT)) {
    Slice(this,sel,count);
    return;
  }
  DictionaryVector::VerifyDictionary(this);
  this_00 = &this->buffer;
  pVVar5 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_00);
  DictionaryVector::VerifyDictionary(this);
  pVVar6 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_00);
  local_60.index = (idx_t)pVVar6[1].data.allocator.ptr;
  DictionaryVector::VerifyDictionary(this);
  pVVar6 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_00);
  local_98 = local_88;
  pdVar1 = pVVar6[1].data.pointer;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pdVar1,pdVar1 + pVVar6[1].data.allocated_size);
  local_58 = (_Hash_node_base *)pVVar5[1]._vptr_VectorBuffer;
  uVar2 = (cache->cache)._M_h._M_bucket_count;
  uVar7 = (ulong)local_58 % uVar2;
  p_Var9 = (cache->cache)._M_h._M_buckets[uVar7];
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var8 = p_Var9->_M_nxt, p_Var10 = p_Var9, local_58 != p_Var9->_M_nxt[1]._M_nxt)) {
    while (p_Var9 = p_Var8, p_Var8 = p_Var9->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((ulong)p_Var8[1]._M_nxt % uVar2 != uVar7) ||
         (p_Var10 = p_Var9, local_58 == p_Var8[1]._M_nxt)) goto LAB_00dbf2d6;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_00dbf2d6:
  if (p_Var10 == (__node_base_ptr)0x0) {
    p_Var8 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var8 = p_Var10->_M_nxt;
  }
  if (p_Var8 == (_Hash_node_base *)0x0) {
    Slice(this,sel,count);
    this_02 = ::std::__detail::
              _Map_base<unsigned_int_*,_std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_std::allocator<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int_*>,_std::hash<unsigned_int_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int_*,_std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_std::allocator<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int_*>,_std::hash<unsigned_int_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)cache,(key_type *)&local_58);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=(this_02,this_00);
  }
  else {
    pVVar5 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                       ((shared_ptr<duckdb::VectorBuffer,_true> *)(p_Var8 + 2));
    make_buffer<duckdb::DictionaryBuffer,duckdb::SelectionVector&>
              ((duckdb *)&local_78,(SelectionVector *)(pVVar5 + 1));
    p_Var4 = p_Stack_70;
    oVar3.index = local_78.index;
    local_78.index = 0;
    p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (this->buffer).internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)oVar3.index;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
    }
    this->vector_type = DICTIONARY_VECTOR;
  }
  if ((Allocator *)local_60.index != (Allocator *)0xffffffffffffffff) {
    pVVar5 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_00);
    index = optional_idx::GetIndex(&local_60);
    optional_idx::optional_idx(&local_78,index);
    pVVar5[1].data.allocator.ptr = (Allocator *)local_78.index;
    if (local_98 == local_88) {
      uStack_38 = uStack_80;
      local_50 = local_40;
    }
    else {
      local_50 = local_98;
    }
    local_48 = local_90;
    local_90 = 0;
    local_88[0] = 0;
    local_98 = local_88;
    ::std::__cxx11::string::operator=((string *)&pVVar5[1].data.pointer,(string *)&local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  return;
}

Assistant:

void Vector::Slice(const SelectionVector &sel, idx_t count, SelCache &cache) {
	if (GetVectorType() == VectorType::DICTIONARY_VECTOR && GetType().InternalType() != PhysicalType::STRUCT) {
		// dictionary vector: need to merge dictionaries
		// check if we have a cached entry
		auto &current_sel = DictionaryVector::SelVector(*this);
		auto dictionary_size = DictionaryVector::DictionarySize(*this);
		auto dictionary_id = DictionaryVector::DictionaryId(*this);
		auto target_data = current_sel.data();
		auto entry = cache.cache.find(target_data);
		if (entry != cache.cache.end()) {
			// cached entry exists: use that
			this->buffer = make_buffer<DictionaryBuffer>(entry->second->Cast<DictionaryBuffer>().GetSelVector());
			vector_type = VectorType::DICTIONARY_VECTOR;
		} else {
			Slice(sel, count);
			cache.cache[target_data] = this->buffer;
		}
		if (dictionary_size.IsValid()) {
			auto &dict_buffer = buffer->Cast<DictionaryBuffer>();
			dict_buffer.SetDictionarySize(dictionary_size.GetIndex());
			dict_buffer.SetDictionaryId(std::move(dictionary_id));
		}
	} else {
		Slice(sel, count);
	}
}